

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log_Scope.h
# Opt level: O0

Log_Entry * __thiscall
Nova::Log::Log_Scope::Get_New_Scope
          (Log_Scope *this,Log_Class *instance,string *new_scope_identifier,string *new_name)

{
  string *psVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  Log_Entry **ppLVar4;
  Log_Scope *this_00;
  size_t sVar5;
  Log_Scope *local_40;
  Log_Entry *new_entry;
  string *psStack_30;
  int entry;
  string *new_name_local;
  string *new_scope_identifier_local;
  Log_Class *instance_local;
  Log_Scope *this_local;
  
  (this->super_Log_Entry).end_on_separate_line = true;
  (this->super_Log_Entry).log_file_end_on_separate_line = true;
  psStack_30 = new_name;
  new_name_local = new_scope_identifier;
  new_scope_identifier_local = (string *)instance;
  instance_local = (Log_Class *)this;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count(&this->entries,new_scope_identifier);
  if ((sVar2 != 0) &&
     (pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->entries,new_name_local), psVar1 = (string *)psStack_30,
     *pmVar3 == new_entry._4_4_)) {
    ppLVar4 = Array<Nova::Log::Log_Entry_*>::operator()(&this->children,new_entry._4_4_);
    std::__cxx11::string::operator=((string *)&(*ppLVar4)->name,psVar1);
    ppLVar4 = Array<Nova::Log::Log_Entry_*>::operator()(&this->children,new_entry._4_4_);
    return *ppLVar4;
  }
  this_00 = (Log_Scope *)operator_new(0xc0);
  Log_Scope(this_00,&this->super_Log_Entry,(this->super_Log_Entry).depth + 1,
            (this->super_Log_Entry).timer_id,new_name_local,psStack_30,
            (this->super_Log_Entry).verbosity_level);
  local_40 = this_00;
  Array<Nova::Log::Log_Entry_*>::Append(&this->children,(Log_Entry **)&local_40);
  sVar5 = Array<Nova::Log::Log_Entry_*>::size(&this->children);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->entries,new_name_local);
  *pmVar3 = (mapped_type)sVar5;
  return &local_40->super_Log_Entry;
}

Assistant:

Log_Entry* Get_New_Scope(Log_Class& instance,const std::string& new_scope_identifier,const std::string& new_name)
    {
        int entry;end_on_separate_line=true;log_file_end_on_separate_line=true;
        if(entries.count(new_scope_identifier)!=0 && entries[new_scope_identifier]==entry){children(entry)->name=new_name;return children(entry);}
        Log_Entry* new_entry=new Log_Scope(this,depth+1,timer_id,new_scope_identifier,new_name,verbosity_level);
        children.Append(new_entry);
        entries[new_scope_identifier]=(int)children.size();
        return new_entry;
    }